

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::RawMessageSet::_InternalSerialize
          (RawMessageSet *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  uint8_t *target_00;
  RepeatedPtrField<proto2_unittest::RawMessageSet_Item> *this_00;
  const_reference value;
  UnknownFieldSet *unknown_fields;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  RawMessageSet *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  RawMessageSet *this_local;
  
  local_30 = 0;
  uVar2 = _internal_item_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_30 < uVar2; local_30 = local_30 + 1) {
    target_00 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    this_00 = _internal_item(this);
    value = google::protobuf::RepeatedPtrField<proto2_unittest::RawMessageSet_Item>::Get
                      (this_00,local_30);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteGroup
                             (1,(MessageLite *)value,target_00,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL RawMessageSet::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const RawMessageSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.RawMessageSet)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated group Item = 1 { ... };
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_item_size());
       i < n; i++) {
    target = stream->EnsureSpace(target);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteGroup(
            1, this_._internal_item().Get(i),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.RawMessageSet)
  return target;
}